

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_stalker::se_stalker(se_stalker *this)

{
  cse_alife_human_stalker::cse_alife_human_stalker(&this->super_cse_alife_human_stalker);
  (this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
  super_cse_alife_trader_abstract._vptr_cse_alife_trader_abstract =
       (_func_int **)&PTR_state_merge_0023c7e8;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract = &PTR__se_stalker_0023c838;
  *(undefined ***)
   &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
    super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x118 =
       &PTR__se_stalker_0023c8a0;
  (this->super_cse_alife_human_stalker).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_stalker_0023c8c8;
  this->m_job_online = '\0';
  this->m_was_in_smart_terrain = false;
  this->m_death_dropped = false;
  (this->m_squad_id)._M_dataplus._M_p = (pointer)&(this->m_squad_id).field_2;
  (this->m_squad_id)._M_string_length = 0;
  (this->m_squad_id).field_2._M_local_buf[0] = '\0';
  this->m_sim_forced_online = false;
  (this->m_old_lvid)._M_dataplus._M_p = (pointer)&(this->m_old_lvid).field_2;
  (this->m_old_lvid)._M_string_length = 0;
  (this->m_old_lvid).field_2._M_local_buf[0] = '\0';
  (this->m_active_section)._M_dataplus._M_p = (pointer)&(this->m_active_section).field_2;
  (this->m_active_section)._M_string_length = 0;
  (this->m_active_section).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

se_stalker::se_stalker(): m_job_online(0), m_was_in_smart_terrain(false), m_death_dropped(false),
	m_sim_forced_online(false) {}